

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

unique_ptr<happly::Property,_std::default_delete<happly::Property>_> * __thiscall
happly::Element::getPropertyPtr(Element *this,string *target)

{
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *puVar1;
  __type _Var2;
  runtime_error *this_00;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *prop;
  unique_ptr<happly::Property,_std::default_delete<happly::Property>_> *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  puVar3 = (this->properties).
           super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->properties).
           super__Vector_base<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>,_std::allocator<std::unique_ptr<happly::Property,_std::default_delete<happly::Property>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar3 == puVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&bStack_88,"PLY parser: element ",&this->name);
      std::operator+(&local_68,&bStack_88," does not have property ");
      std::operator+(&local_48,&local_68,target);
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var2 = std::operator==(&((puVar3->_M_t).
                              super___uniq_ptr_impl<happly::Property,_std::default_delete<happly::Property>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_happly::Property_*,_std::default_delete<happly::Property>_>
                              .super__Head_base<0UL,_happly::Property_*,_false>._M_head_impl)->name,
                            target);
    if (_Var2) break;
    puVar3 = puVar3 + 1;
  }
  return puVar3;
}

Assistant:

std::unique_ptr<Property>& getPropertyPtr(const std::string& target) {
    for (std::unique_ptr<Property>& prop : properties) {
      if (prop->name == target) {
        return prop;
      }
    }
    throw std::runtime_error("PLY parser: element " + name + " does not have property " + target);
  }